

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall CVmGramProdMem::~CVmGramProdMem(CVmGramProdMem *this)

{
  CVmGramProdMemBlock *pCVar1;
  CVmGramProdMemBlock *__ptr;
  
  __ptr = this->block_head_;
  while (__ptr != (CVmGramProdMemBlock *)0x0) {
    pCVar1 = __ptr->nxt_;
    free(__ptr);
    this->block_head_ = pCVar1;
    __ptr = pCVar1;
  }
  return;
}

Assistant:

~CVmGramProdMem()
    {
        /* delete each of our blocks */
        while (block_head_ != 0)
        {
            CVmGramProdMemBlock *nxt;
            
            /* remember the next block */
            nxt = block_head_->nxt_;
            
            /* delete this block */
            t3free(block_head_);

            /* move on to the next */
            block_head_ = nxt;
        }
    }